

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::GenerateTargetManifest(cmGeneratorTarget *this,string *config)

{
  cmTarget *this_00;
  cmGlobalGenerator *this_01;
  string f;
  string dir;
  string pdbName;
  string impName;
  string realName;
  string name;
  string soName;
  string local_40;
  
  if (this->Target->IsImportedTarget != false) {
    return;
  }
  this_01 = cmMakefile::GetGlobalGenerator(this->Target->Makefile);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  soName._M_dataplus._M_p = (pointer)&soName.field_2;
  soName._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  soName.field_2._M_local_buf[0] = '\0';
  realName._M_dataplus._M_p = (pointer)&realName.field_2;
  realName._M_string_length = 0;
  impName._M_dataplus._M_p = (pointer)&impName.field_2;
  impName._M_string_length = 0;
  realName.field_2._M_local_buf[0] = '\0';
  impName.field_2._M_local_buf[0] = '\0';
  pdbName._M_dataplus._M_p = (pointer)&pdbName.field_2;
  pdbName._M_string_length = 0;
  pdbName.field_2._M_local_buf[0] = '\0';
  this_00 = this->Target;
  if (this_00->TargetTypeValue - STATIC_LIBRARY < 3) {
    cmTarget::GetLibraryNames(this_00,&name,&soName,&realName,&impName,&pdbName,config);
  }
  else {
    if (this_00->TargetTypeValue != EXECUTABLE) goto LAB_003b072b;
    cmTarget::GetExecutableNames(this_00,&name,&realName,&impName,&pdbName,config);
  }
  cmTarget::GetDirectory(&dir,this->Target,config,false);
  f._M_dataplus._M_p = (pointer)&f.field_2;
  f._M_string_length = 0;
  f.field_2._M_local_buf[0] = '\0';
  if (name._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_01,config,&f);
  }
  if (soName._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_01,config,&f);
  }
  if (realName._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_01,config,&f);
  }
  if (pdbName._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_01,config,&f);
  }
  if (impName._M_string_length != 0) {
    cmTarget::GetDirectory(&local_40,this->Target,config,true);
    std::__cxx11::string::operator=((string *)&f,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_01,config,&f);
  }
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&dir);
LAB_003b072b:
  std::__cxx11::string::~string((string *)&pdbName);
  std::__cxx11::string::~string((string *)&impName);
  std::__cxx11::string::~string((string *)&realName);
  std::__cxx11::string::~string((string *)&soName);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void cmGeneratorTarget::GenerateTargetManifest(
                                              const std::string& config) const
{
  if (this->Target->IsImported())
    {
    return;
    }
  cmMakefile* mf = this->Target->GetMakefile();
  cmGlobalGenerator* gg = mf->GetGlobalGenerator();

  // Get the names.
  std::string name;
  std::string soName;
  std::string realName;
  std::string impName;
  std::string pdbName;
  if(this->GetType() == cmTarget::EXECUTABLE)
    {
    this->Target->GetExecutableNames(name, realName, impName, pdbName,
                                     config);
    }
  else if(this->GetType() == cmTarget::STATIC_LIBRARY ||
          this->GetType() == cmTarget::SHARED_LIBRARY ||
          this->GetType() == cmTarget::MODULE_LIBRARY)
    {
    this->Target->GetLibraryNames(name, soName, realName, impName, pdbName,
                                  config);
    }
  else
    {
    return;
    }

  // Get the directory.
  std::string dir = this->Target->GetDirectory(config, false);

  // Add each name.
  std::string f;
  if(!name.empty())
    {
    f = dir;
    f += "/";
    f += name;
    gg->AddToManifest(config, f);
    }
  if(!soName.empty())
    {
    f = dir;
    f += "/";
    f += soName;
    gg->AddToManifest(config, f);
    }
  if(!realName.empty())
    {
    f = dir;
    f += "/";
    f += realName;
    gg->AddToManifest(config, f);
    }
  if(!pdbName.empty())
    {
    f = dir;
    f += "/";
    f += pdbName;
    gg->AddToManifest(config, f);
    }
  if(!impName.empty())
    {
    f = this->Target->GetDirectory(config, true);
    f += "/";
    f += impName;
    gg->AddToManifest(config, f);
    }
}